

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool __thiscall ClipperLib::Clipper::IsContributing(Clipper *this,TEdge *edge)

{
  PolyFillType PVar1;
  PolyFillType PVar2;
  PolyFillType PVar3;
  PolyFillType PVar4;
  
  PVar1 = this->m_ClipFillType;
  PVar2 = this->m_SubjFillType;
  PVar3 = PVar1;
  PVar4 = PVar2;
  if (edge->PolyTyp == ptSubject) {
    PVar3 = PVar2;
    PVar4 = PVar1;
  }
  if (PVar3 == pftPositive) {
LAB_00111205:
    if (edge->WindCnt != 1) {
      return false;
    }
  }
  else if (PVar3 == pftNonZero) {
    if ((edge->WindCnt + 1U & 0xfffffffd) != 0) {
      return false;
    }
  }
  else if (PVar3 == pftEvenOdd) {
    if (edge->WindDelta == 0) goto LAB_00111205;
  }
  else if (edge->WindCnt != -1) {
    return false;
  }
  switch(this->m_ClipType) {
  case ctIntersection:
    PVar2 = PVar4;
    break;
  case ctDifference:
    if (edge->PolyTyp == ptSubject) goto joined_r0x0011127c;
    break;
  case ctXor:
    if (edge->WindDelta != 0) {
      return true;
    }
  case ctUnion:
    PVar1 = PVar4;
joined_r0x0011127c:
    if (PVar1 < pftPositive) {
      return edge->WindCnt2 == 0;
    }
    if (PVar1 != pftPositive) {
      return -1 < edge->WindCnt2;
    }
    return edge->WindCnt2 < 1;
  default:
    return true;
  }
  if (PVar2 < pftPositive) {
    return edge->WindCnt2 != 0;
  }
  if (PVar2 != pftPositive) {
    return SUB41((uint)edge->WindCnt2 >> 0x1f,0);
  }
  return 0 < edge->WindCnt2;
}

Assistant:

bool Clipper::IsContributing(const TEdge& edge) const
{
  PolyFillType pft, pft2;
  if (edge.PolyTyp == ptSubject)
  {
    pft = m_SubjFillType;
    pft2 = m_ClipFillType;
  } else
  {
    pft = m_ClipFillType;
    pft2 = m_SubjFillType;
  }

  switch(pft)
  {
    case pftEvenOdd: 
      //return false if a subj line has been flagged as inside a subj polygon
      if (edge.WindDelta == 0 && edge.WindCnt != 1) return false;
      break;
    case pftNonZero:
      if (Abs(edge.WindCnt) != 1) return false;
      break;
    case pftPositive: 
      if (edge.WindCnt != 1) return false;
      break;
    default: //pftNegative
      if (edge.WindCnt != -1) return false;
  }

  switch(m_ClipType)
  {
    case ctIntersection:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.WindCnt2 != 0);
        case pftPositive: 
          return (edge.WindCnt2 > 0);
        default: 
          return (edge.WindCnt2 < 0);
      }
      break;
    case ctUnion:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.WindCnt2 == 0);
        case pftPositive: 
          return (edge.WindCnt2 <= 0);
        default: 
          return (edge.WindCnt2 >= 0);
      }
      break;
    case ctDifference:
      if (edge.PolyTyp == ptSubject)
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 == 0);
          case pftPositive: 
            return (edge.WindCnt2 <= 0);
          default: 
            return (edge.WindCnt2 >= 0);
        }
      else
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 != 0);
          case pftPositive: 
            return (edge.WindCnt2 > 0);
          default: 
            return (edge.WindCnt2 < 0);
        }
      break;
    case ctXor:
      if (edge.WindDelta == 0) //XOr always contributing unless open
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 == 0);
          case pftPositive: 
            return (edge.WindCnt2 <= 0);
          default: 
            return (edge.WindCnt2 >= 0);
        }
      else 
        return true;
      break;
    default:
      return true;
  }
}